

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseReference
                 (char *in,char *end,
                 vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names)

{
  pointer *pppNVar1;
  byte bVar2;
  iterator iVar3;
  byte *in_00;
  Name *nextName;
  Name *local_28;
  
  if (in != end && in != (char *)0x0) {
    local_28 = (Name *)0x0;
    in = parseName(in,end,&local_28);
    if (local_28 != (Name *)0x0) {
      iVar3._M_current =
           (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
        _M_realloc_insert<ODDLParser::Name*const&>
                  ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar3,
                   &local_28);
      }
      else {
        *iVar3._M_current = local_28;
        pppNVar1 = &(names->
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
    }
    bVar2 = *in;
    while (bVar2 == 0x2c) {
      do {
        do {
          in_00 = (byte *)in;
          bVar2 = *in_00;
          in = (char *)(in_00 + 1);
        } while (in_00 == (byte *)end);
      } while (bVar2 != 0x2c &&
               (((bVar2 & 0xfe) != 0x28 && bVar2 != 0x5b) &&
               ((bVar2 != 0x7d && bVar2 != 0x7b) && (bVar2 != 0x20 && bVar2 != 9))));
      if (bVar2 != 0x2c) {
        return (char *)in_00;
      }
      in = parseName((char *)in_00,end,&local_28);
      if (local_28 != (Name *)0x0) {
        iVar3._M_current =
             (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (names->super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>>::
          _M_realloc_insert<ODDLParser::Name*const&>
                    ((vector<ODDLParser::Name*,std::allocator<ODDLParser::Name*>> *)names,iVar3,
                     &local_28);
        }
        else {
          *iVar3._M_current = local_28;
          pppNVar1 = &(names->
                      super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      bVar2 = *in;
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseReference( char *in, char *end, std::vector<Name*> &names ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Name *nextName( ddl_nullptr );
    in = parseName( in, end, &nextName );
    if( nextName ) {
        names.push_back( nextName );
    }
    while( Grammar::CommaSeparator[ 0 ] == *in ) {
        in = getNextSeparator( in, end );
        if( Grammar::CommaSeparator[ 0 ] == *in ) {
            in = parseName( in, end, &nextName );
            if( nextName ) {
                names.push_back( nextName );
            }
        } else {
            break;
        }
    }

    return in;
}